

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

bool __thiscall
wasm::analysis::Vector<wasm::RandomFullLattice>::join
          (Vector<wasm::RandomFullLattice> *this,Element *joinee,Element *joiner)

{
  bool bVar1;
  size_type sVar2;
  const_reference elem;
  bool bVar3;
  ulong local_30;
  size_t i;
  bool result;
  Element *joiner_local;
  Element *joinee_local;
  Vector<wasm::RandomFullLattice> *this_local;
  
  sVar2 = std::
          vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>
          ::size(joinee);
  if (sVar2 != this->size) {
    __assert_fail("joinee.size() == size",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/analysis/lattices/vector.h"
                  ,0x54,
                  "bool wasm::analysis::Vector<wasm::RandomFullLattice>::join(Element &, const Element &) const [L = wasm::RandomFullLattice]"
                 );
  }
  sVar2 = std::
          vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>
          ::size(joiner);
  if (sVar2 == this->size) {
    bVar3 = false;
    for (local_30 = 0; local_30 < this->size; local_30 = local_30 + 1) {
      elem = std::
             vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>
             ::operator[](joiner,local_30);
      bVar1 = joinAtIndex(this,joinee,local_30,elem);
      bVar3 = bVar3 != false || bVar1;
    }
    return bVar3;
  }
  __assert_fail("joiner.size() == size",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/analysis/lattices/vector.h"
                ,0x55,
                "bool wasm::analysis::Vector<wasm::RandomFullLattice>::join(Element &, const Element &) const [L = wasm::RandomFullLattice]"
               );
}

Assistant:

bool join(Element& joinee, const Element& joiner) const noexcept {
    assert(joinee.size() == size);
    assert(joiner.size() == size);
    bool result = false;
    for (size_t i = 0; i < size; ++i) {
      result |= joinAtIndex(joinee, i, joiner[i]);
    }
    return result;
  }